

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeMergeEngineInit(SortSubtask *pTask,MergeEngine *pMerger,int eMode)

{
  PmaReader *pPVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int local_3c;
  SortSubtask *local_38;
  
  uVar7 = pMerger->nTree;
  pMerger->pTask = pTask;
  lVar10 = 0;
  uVar6 = 0;
  if (0 < (int)uVar7) {
    uVar6 = (ulong)uVar7;
  }
  do {
    uVar7 = uVar7 - 1;
    if (uVar6 * 0x50 - lVar10 == 0) {
      iVar3 = pMerger->nTree;
      uVar6 = (ulong)(iVar3 - 1);
      uVar7 = iVar3 * 2;
      local_38 = pTask;
      while( true ) {
        uVar2 = uVar7 - 2;
        if (iVar3 < 2) break;
        iVar4 = pMerger->nTree / 2;
        if (iVar4 < iVar3) {
          iVar8 = uVar2 + iVar4 * -2;
          iVar4 = iVar8 + 1;
        }
        else {
          iVar8 = pMerger->aTree[uVar2];
          iVar4 = pMerger->aTree[uVar7 - 1];
        }
        pPVar1 = pMerger->aReadr;
        iVar9 = iVar4;
        if ((pPVar1[iVar8].pFd != (sqlite3_file *)0x0) &&
           (iVar9 = iVar8, pPVar1[iVar4].pFd != (sqlite3_file *)0x0)) {
          local_3c = 0;
          iVar5 = (*pMerger->pTask->xCompare)
                            (pMerger->pTask,&local_3c,pPVar1[iVar8].aKey,pPVar1[iVar8].nKey,
                             pPVar1[iVar4].aKey,pPVar1[iVar4].nKey);
          iVar9 = iVar4;
          if (iVar5 < 1) {
            iVar9 = iVar8;
          }
        }
        pMerger->aTree[uVar6] = iVar9;
        iVar3 = iVar3 + -1;
        uVar6 = uVar6 - 1;
        uVar7 = uVar2;
      }
      return (uint)local_38->pUnpacked->errCode;
    }
    if (eMode == 2) {
      iVar3 = vdbePmaReaderNext(pMerger->aReadr + (int)uVar7);
    }
    else {
      iVar3 = vdbePmaReaderIncrInit((PmaReader *)((long)&pMerger->aReadr->iReadOff + lVar10),0);
    }
    lVar10 = lVar10 + 0x50;
  } while (iVar3 == 0);
  return iVar3;
}

Assistant:

static int vdbeMergeEngineInit(
  SortSubtask *pTask,             /* Thread that will run pMerger */
  MergeEngine *pMerger,           /* MergeEngine to initialize */
  int eMode                       /* One of the INCRINIT_XXX constants */
){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* For looping over PmaReader objects */
  int nTree = pMerger->nTree;

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  /* Verify that the MergeEngine is assigned to a single thread */
  assert( pMerger->pTask==0 );
  pMerger->pTask = pTask;

  for(i=0; i<nTree; i++){
    if( SQLITE_MAX_WORKER_THREADS>0 && eMode==INCRINIT_ROOT ){
      /* PmaReaders should be normally initialized in order, as if they are
      ** reading from the same temp file this makes for more linear file IO.
      ** However, in the INCRINIT_ROOT case, if PmaReader aReadr[nTask-1] is
      ** in use it will block the vdbePmaReaderNext() call while it uses
      ** the main thread to fill its buffer. So calling PmaReaderNext()
      ** on this PmaReader before any of the multi-threaded PmaReaders takes
      ** better advantage of multi-processor hardware. */
      rc = vdbePmaReaderNext(&pMerger->aReadr[nTree-i-1]);
    }else{
      rc = vdbePmaReaderIncrInit(&pMerger->aReadr[i], INCRINIT_NORMAL);
    }
    if( rc!=SQLITE_OK ) return rc;
  }

  for(i=pMerger->nTree-1; i>0; i--){
    vdbeMergeEngineCompare(pMerger, i);
  }
  return pTask->pUnpacked->errCode;
}